

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_P_encryption.c
# Opt level: O3

void test_P_encryption(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_encrypted.zip");
  wVar1 = systemf("%s -P password %s >test.out 2>test.err",testprog,"test_encrypted.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_P_encryption.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_P_encryption.c"
             ,L'\x12',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_P_encryption.c"
             ,L'\x13',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_P_encryption.c"
             ,L'\x15',"plaintext\n","encrypted/file.txt");
  return;
}

Assistant:

DEFINE_TEST(test_P_encryption)
{
	const char *reffile = "test_encrypted.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -P password %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("plaintext\n", "encrypted/file.txt");
}